

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pagerFixMaplimit(Pager *pPager)

{
  sqlite3_io_methods *psVar1;
  sqlite3_int64 sz;
  long local_8;
  
  psVar1 = pPager->fd->pMethods;
  if (psVar1 != (sqlite3_io_methods *)0x0) {
    local_8 = pPager->szMmap;
    pPager->bUseFetch = 0 < local_8 && 2 < psVar1->iVersion;
    (*psVar1->xFileControl)(pPager->fd,0x12,&local_8);
  }
  return;
}

Assistant:

static void pagerFixMaplimit(Pager *pPager){
#if SQLITE_MAX_MMAP_SIZE>0
  sqlite3_file *fd = pPager->fd;
  if( isOpen(fd) ){
    sqlite3_int64 sz;
    pPager->bUseFetch = (fd->pMethods->iVersion>=3) && pPager->szMmap>0;
    sz = pPager->szMmap;
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_MMAP_SIZE, &sz);
  }
#endif
}